

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

ActionResult * __thiscall
spectest::CommandRunner::RunAction
          (ActionResult *__return_storage_ptr__,CommandRunner *this,int line_number,Action *action,
          RunVerbosity verbose)

{
  bool bVar1;
  Enum EVar2;
  ulong uVar3;
  mapped_type *other;
  undefined8 uVar4;
  undefined8 uVar5;
  FuncType *pFVar6;
  pointer this_00;
  Extern *pEVar7;
  GlobalType *pGVar8;
  string_view name;
  undefined1 auVar9 [16];
  Ptr *in_stack_ffffffffffffff20;
  Values *this_01;
  ExportMap *local_b0;
  anon_union_16_6_113bff37_for_Value_0 local_90;
  Global *local_80;
  Global *global;
  size_t local_70;
  Result local_64;
  Func *pFStack_60;
  Result ok;
  Func *func;
  undefined1 local_50 [8];
  Ptr extern_;
  ExportMap *module;
  RunVerbosity verbose_local;
  Action *action_local;
  int line_number_local;
  CommandRunner *this_local;
  ActionResult *result;
  
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    local_b0 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>_>_>_>
               ::operator[](&this->instances_,&action->module_name);
  }
  else {
    local_b0 = &this->last_instance_;
  }
  extern_.root_index_ = (Index)local_b0;
  other = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
          ::operator[](local_b0,&action->field_name);
  wabt::interp::RefPtr<wabt::interp::Extern>::RefPtr((RefPtr<wabt::interp::Extern> *)local_50,other)
  ;
  bVar1 = wabt::interp::RefPtr::operator_cast_to_bool((RefPtr *)local_50);
  if (bVar1) {
    ActionResult::ActionResult(__return_storage_ptr__);
    if (action->type == Invoke) {
      pEVar7 = wabt::interp::RefPtr<wabt::interp::Extern>::get
                         ((RefPtr<wabt::interp::Extern> *)local_50);
      pFStack_60 = wabt::cast<wabt::interp::Func,wabt::interp::Extern>(pEVar7);
      local_64 = wabt::interp::Func::Call
                           (pFStack_60,&this->store_,&action->args,&__return_storage_ptr__->values,
                            &__return_storage_ptr__->trap,s_trace_stream);
      EVar2 = wabt::Result::operator_cast_to_Enum(&local_64);
      bVar1 = wabt::interp::RefPtr::operator_cast_to_bool((RefPtr *)&__return_storage_ptr__->trap);
      if ((EVar2 == Ok) != (bool)((bVar1 ^ 0xffU) & 1)) {
        __assert_fail("(ok == Result::Ok) == (!result.trap)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/spectest-interp.cc"
                      ,0x590,
                      "ActionResult spectest::CommandRunner::RunAction(int, const Action *, RunVerbosity)"
                     );
      }
      pFVar6 = wabt::interp::Func::type(pFStack_60);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                (&__return_storage_ptr__->types,&pFVar6->results);
      if (verbose == Verbose) {
        this_00 = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::get
                            (&s_stdout_stream);
        auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)&action->field_name);
        local_70 = auVar9._8_8_;
        global = auVar9._0_8_;
        pFVar6 = wabt::interp::Func::type(pFStack_60);
        name._M_str = (char *)pFVar6;
        name._M_len = local_70;
        wabt::interp::WriteCall
                  ((interp *)this_00,(Stream *)global,name,(FuncType *)&action->args,
                   &__return_storage_ptr__->values,(Values *)&__return_storage_ptr__->trap,
                   in_stack_ffffffffffffff20);
      }
    }
    else {
      if (action->type != Get) {
        abort();
      }
      pEVar7 = wabt::interp::RefPtr<wabt::interp::Extern>::get
                         ((RefPtr<wabt::interp::Extern> *)local_50);
      local_80 = wabt::cast<wabt::interp::Global,wabt::interp::Extern>(pEVar7);
      this_01 = &__return_storage_ptr__->values;
      local_90.v128_.v = (v128)wabt::interp::Global::Get(local_80);
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::push_back
                (this_01,(value_type *)&local_90.v128_);
      pGVar8 = wabt::interp::Global::type(local_80);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back
                (&__return_storage_ptr__->types,(value_type *)&(pGVar8->super_ExternType).field_0xc)
      ;
    }
  }
  else {
    uVar4 = std::__cxx11::string::c_str();
    uVar5 = std::__cxx11::string::c_str();
    PrintError(this,line_number,"unknown invoke \"%s.%s\"",uVar4,uVar5);
    memset(__return_storage_ptr__,0,0x18);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&__return_storage_ptr__->types);
    memset(&__return_storage_ptr__->values,0,0x18);
    std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
              (&__return_storage_ptr__->values);
    wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr(&__return_storage_ptr__->trap);
  }
  wabt::interp::RefPtr<wabt::interp::Extern>::~RefPtr((RefPtr<wabt::interp::Extern> *)local_50);
  return __return_storage_ptr__;
}

Assistant:

ActionResult CommandRunner::RunAction(int line_number,
                                      const Action* action,
                                      RunVerbosity verbose) {
  ExportMap& module = !action->module_name.empty()
                          ? instances_[action->module_name]
                          : last_instance_;
  Extern::Ptr extern_ = module[action->field_name];
  if (!extern_) {
    PrintError(line_number, "unknown invoke \"%s.%s\"",
               action->module_name.c_str(), action->field_name.c_str());
    return {};
  }

  ActionResult result;

  switch (action->type) {
    case ActionType::Invoke: {
      auto* func = cast<interp::Func>(extern_.get());
      auto ok = func->Call(store_, action->args, result.values, &result.trap,
                           s_trace_stream);
      assert((ok == Result::Ok) == (!result.trap));
      result.types = func->type().results;
      if (verbose == RunVerbosity::Verbose) {
        WriteCall(s_stdout_stream.get(), action->field_name, func->type(),
                  action->args, result.values, result.trap);
      }
      break;
    }

    case ActionType::Get: {
      auto* global = cast<interp::Global>(extern_.get());
      result.values.push_back(global->Get());
      result.types.push_back(global->type().type);
      break;
    }

    default:
      WABT_UNREACHABLE;
  }

  return result;
}